

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O0

int32 make_ci_list_cd_hash_frm_phnlist
                (char *phnlist,char ***CIlist,int32 *cilistsize,hashelement_t ***CDhash,
                int32 *NCDphones)

{
  int32 iVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  size_t sVar4;
  hashelement_t *phVar5;
  FILE *fp;
  int32 nwds;
  int32 nciphns;
  int32 i;
  int32 heapsize;
  int32 phnsize;
  int32 maxphnsize;
  int32 iwdtphs;
  int32 ewdtphs;
  int32 bwdtphs;
  int32 swdtphs;
  phnhashelement_t *phnptr;
  phnhashelement_t **phnhash;
  hashelement_t *tphnptr;
  hashelement_t **tphnhash;
  heapelement_t *addciphone;
  heapelement_t **heap;
  lineiter_t *line;
  char *silence;
  char **cilist;
  char wdpos [1024];
  char rctx [1024];
  char lctx [1024];
  char bphn [1024];
  int32 *NCDphones_local;
  hashelement_t ***CDhash_local;
  int32 *cilistsize_local;
  char ***CIlist_local;
  char *phnlist_local;
  
  line = (lineiter_t *)anon_var_dwarf_b21;
  heap = (heapelement_t **)0x0;
  addciphone = (heapelement_t *)0x0;
  __stream = fopen(phnlist,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x74,"Unable to open %s for reading\n",phnlist);
    exit(1);
  }
  phnptr = (phnhashelement_t *)calloc(0x65,8);
  tphnptr = (hashelement_t *)
            __ckd_calloc__(0x5dc1,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                           ,0x78);
  heapsize = 0;
  phnsize = 0;
  maxphnsize = 0;
  iwdtphs = 0;
  ewdtphs = 0;
  phninstall((char *)line,(phnhashelement_t **)phnptr);
  for (heap = (heapelement_t **)lineiter_start_clean((FILE *)__stream);
      heap != (heapelement_t **)0x0; heap = (heapelement_t **)lineiter_next((lineiter_t *)heap)) {
    iVar2 = __isoc99_sscanf(*heap,"%s %s %s %s",lctx + 0x3f8,rctx + 0x3f8,wdpos + 0x3f8,&cilist);
    if (((iVar2 != 1) && (iVar2 != 3)) && (iVar2 != 4)) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x83,"Incorrect format in triphone file %s\n%s\n",phnlist,*heap);
      exit(1);
    }
    iVar3 = strcmp(lctx + 0x3f8,"-");
    if (iVar3 == 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x85,"Bad entry triphone file %s\n%s\n",phnlist,*heap);
      exit(1);
    }
    if ((iVar2 == 1) ||
       ((iVar3 = strcmp(rctx + 0x3f8,"-"), iVar3 == 0 &&
        (iVar3 = strcmp(wdpos + 0x3f8,"-"), iVar3 == 0)))) {
      sVar4 = strlen(lctx + 0x3f8);
      i = (int32)sVar4;
      if (heapsize < i) {
        heapsize = i;
      }
      phninstall(lctx + 0x3f8,(phnhashelement_t **)phnptr);
    }
    else {
      if (iVar2 == 3) {
        strcpy((char *)&cilist,"i");
      }
      iVar2 = strcmp(rctx + 0x3f8,"-");
      if (((iVar2 == 0) && (iVar2 = strcmp(wdpos + 0x3f8,"-"), iVar2 == 0)) &&
         (iVar2 = strcmp((char *)&cilist,"-"), iVar2 == 0)) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                ,0x8f,"Bad entry triphone file %s\n%s\n",phnlist,*heap);
      }
      else if ((((rctx[0x3f8] == '+') || (iVar2 = strcmp(rctx + 0x3f8,"SIL"), iVar2 == 0)) ||
               (wdpos[0x3f8] == '+')) || (iVar2 = strcmp(wdpos + 0x3f8,"SIL"), iVar2 == 0)) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                ,0x93,"Fillers in triphone, skipping:\n%s\n",*heap);
      }
      else {
        iVar2 = strcmp((char *)&cilist,"i");
        if (((iVar2 == 0) && (iVar2 = strcmp((char *)&cilist,"b"), iVar2 == 0)) &&
           ((iVar2 = strcmp((char *)&cilist,"e"), iVar2 == 0 &&
            (iVar2 = strcmp((char *)&cilist,"s"), iVar2 == 0)))) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x98,"Bad word position type %s in triphone list\n",&cilist);
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x99,"Mapping it to word internal triphone\n");
          strcpy((char *)&cilist,"i");
        }
        phnhash = (phnhashelement_t **)
                  install(lctx + 0x3f8,rctx + 0x3f8,wdpos + 0x3f8,(char *)&cilist,
                          (hashelement_t **)tphnptr);
        if (((hashelement_t *)phnhash)->dictcount == 0) {
          iVar2 = strcmp((char *)&cilist,"s");
          if (iVar2 == 0) {
            ewdtphs = ewdtphs + 1;
          }
          else {
            iVar2 = strcmp((char *)&cilist,"b");
            if (iVar2 == 0) {
              iwdtphs = iwdtphs + 1;
            }
            else {
              iVar2 = strcmp((char *)&cilist,"e");
              if (iVar2 == 0) {
                maxphnsize = maxphnsize + 1;
              }
              else {
                iVar2 = strcmp((char *)&cilist,"i");
                if (iVar2 == 0) {
                  phnsize = phnsize + 1;
                }
              }
            }
          }
          *(int *)(phnhash + 4) = *(int *)(phnhash + 4) + 1;
        }
      }
    }
  }
  fclose(__stream);
  nciphns = 0;
  for (nwds = 0; nwds < 0x65; nwds = nwds + 1) {
    for (_bwdtphs = (&phnptr->phone)[nwds]; _bwdtphs != (char *)0x0;
        _bwdtphs = *(char **)(_bwdtphs + 0x10)) {
      tphnhash = (hashelement_t **)
                 __ckd_calloc__(1,0x28,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                ,0xad);
      phVar5 = (hashelement_t *)strdup(*(char **)_bwdtphs);
      *tphnhash = phVar5;
      nciphns = insert((heapelement_t ***)&addciphone,nciphns,(heapelement_t *)tphnhash);
    }
  }
  freephnhash((phnhashelement_t **)phnptr);
  iVar1 = nciphns;
  *cilistsize = nciphns;
  silence = (char *)__ckd_calloc_2d__((long)nciphns,(long)(heapsize + 1),1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                      ,0xb5);
  *CIlist = (char **)silence;
  for (nwds = 0; nwds < iVar1; nwds = nwds + 1) {
    tphnhash = (hashelement_t **)yanktop((heapelement_t ***)&addciphone,nciphns,&nciphns);
    strcpy(*(char **)(silence + (long)nwds * 8),((heapelement_t *)tphnhash)->basephone);
    free_heapelement((heapelement_t *)tphnhash);
  }
  if (nciphns != 0) {
    __assert_fail("heapsize == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0xbb,
                  "int32 make_ci_list_cd_hash_frm_phnlist(const char *, char ***, int32 *, hashelement_t ***, int32 *)"
                 );
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0xbd,"%d single word triphones in input phone list\n",(ulong)(uint)ewdtphs);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0xbe,"%d word beginning triphones in input phone list\n",(ulong)(uint)iwdtphs);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0xbf,"%d word internal triphones in input phone list\n",(ulong)(uint)phnsize);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0xc0,"%d word ending triphones in input phone list\n",(ulong)(uint)maxphnsize);
  *CDhash = (hashelement_t **)tphnptr;
  *NCDphones = ewdtphs + iwdtphs + phnsize + maxphnsize;
  return 0;
}

Assistant:

int32 make_ci_list_cd_hash_frm_phnlist(const char  *phnlist,
		           	    char  ***CIlist, 
                           	    int32 *cilistsize,
			   	    hashelement_t ***CDhash,
				    int32 *NCDphones)
{
    char  bphn[1024],lctx[1024], rctx[1024], wdpos[1024]; 
    char  **cilist, *silence="SIL";
    lineiter_t *line = NULL;
    heapelement_t **heap=NULL, *addciphone;
    hashelement_t **tphnhash, *tphnptr;
    phnhashelement_t  **phnhash, *phnptr;

    int32 swdtphs, bwdtphs, ewdtphs, iwdtphs, maxphnsize, phnsize;
    int32 heapsize, i, nciphns, nwds;
    FILE  *fp;

    fp = fopen(phnlist,"r");
    if (fp==NULL) E_FATAL("Unable to open %s for reading\n",phnlist);

   /* Initially hash everything to remove duplications */
    phnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t*));
    tphnhash = (hashelement_t**) ckd_calloc(HASHSIZE, sizeof(hashelement_t*));
    maxphnsize = 0;
    swdtphs = bwdtphs = ewdtphs = iwdtphs = 0;
    /* Always install SIL in phonelist */
    phninstall(silence,phnhash);

    for (line = lineiter_start_clean(fp); line; line = lineiter_next(line)) {

        nwds = sscanf(line->buf,"%s %s %s %s",bphn,lctx,rctx,wdpos);

        if (nwds != 1 && nwds != 3 &&  nwds != 4)
	    E_FATAL("Incorrect format in triphone file %s\n%s\n",phnlist,line->buf);
        if (strcmp(bphn,"-") == 0)
	    E_FATAL("Bad entry triphone file %s\n%s\n",phnlist,line->buf);
	    
        if (nwds == 1 || (!strcmp(lctx,"-") && !strcmp(rctx,"-"))) {
	    phnsize = strlen(bphn);
 	    if (phnsize > maxphnsize) maxphnsize = phnsize;
	    phninstall(bphn,phnhash);
        }
        else {
            if (nwds == 3) strcpy(wdpos,"i"); /* default */
            if (!strcmp(lctx,"-") && !strcmp(rctx,"-") && !strcmp(wdpos,"-")){
	        E_WARN("Bad entry triphone file %s\n%s\n",phnlist,line->buf);
		continue;
	    }
	    if (IS_FILLER(lctx) || IS_FILLER(rctx)){
		E_WARN("Fillers in triphone, skipping:\n%s\n",line->buf);
		continue;
	    }
            if (!strcmp(wdpos,"i") && !strcmp(wdpos,"b") && 
		!strcmp(wdpos,"e") && !strcmp(wdpos,"s")){
		E_WARN("Bad word position type %s in triphone list\n",wdpos);
		E_WARN("Mapping it to word internal triphone\n");
		strcpy(wdpos,"i");
	    }
            tphnptr = install(bphn,lctx,rctx,wdpos,tphnhash);
	    if (tphnptr->dictcount == 0){
	        if (strcmp(wdpos,"s")==0) swdtphs++;
	        else if (strcmp(wdpos,"b")==0) bwdtphs++;
	        else if (strcmp(wdpos,"e")==0) ewdtphs++;
	        else if (strcmp(wdpos,"i")==0) iwdtphs++;
	        tphnptr->dictcount++;
	    }
	}
    }
    fclose(fp);

    /* Heap sort CI phones */
    heapsize = 0;
    for (i = 0; i < PHNHASHSIZE; i++) {
        phnptr = phnhash[i];
        while (phnptr != NULL) {
            addciphone = (heapelement_t *) ckd_calloc(1,sizeof(heapelement_t));
            addciphone->basephone = strdup(phnptr->phone);
            heapsize = insert(&heap, heapsize, addciphone);
            phnptr = phnptr->next;
        }
    }
    freephnhash(phnhash);
    *cilistsize = nciphns = heapsize;
    *CIlist = cilist = (char**)ckd_calloc_2d(nciphns,maxphnsize+1,sizeof(char));
    for (i = 0; i < nciphns; i++){
	addciphone = yanktop(&heap,heapsize,&heapsize);
        strcpy(cilist[i],addciphone->basephone);
        free_heapelement(addciphone);
    }
    assert(heapsize == 0);

    E_INFO("%d single word triphones in input phone list\n",swdtphs);
    E_INFO("%d word beginning triphones in input phone list\n",bwdtphs);
    E_INFO("%d word internal triphones in input phone list\n",iwdtphs);
    E_INFO("%d word ending triphones in input phone list\n",ewdtphs);

    *CDhash = tphnhash;
    *NCDphones = swdtphs + bwdtphs + iwdtphs + ewdtphs;

    return S3_SUCCESS;
}